

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElseExpr(BinaryReaderInterp *this)

{
  Offset fixup_offset;
  pointer pLVar1;
  Result RVar2;
  Enum EVar3;
  Offset OVar4;
  Location loc;
  Location local_38;
  
  local_38.field_1.field_0.last_column = 0;
  local_38.filename._M_len = (this->filename_)._M_len;
  local_38.filename._M_str = (this->filename_)._M_str;
  local_38.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnElse(&this->validator_,&local_38);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar1 == (this->label_stack_).
                  super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x186,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    fixup_offset = pLVar1[-1].fixup_offset;
    Istream::Emit(this->istream_,Br);
    OVar4 = Istream::EmitFixupU32(this->istream_);
    pLVar1[-1].fixup_offset = OVar4;
    Istream::ResolveFixupU32(this->istream_,fixup_offset);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnElseExpr() {
  CHECK_RESULT(validator_.OnElse(GetLocation()));
  Label* label = TopLabel();
  Istream::Offset fixup_cond_offset = label->fixup_offset;
  istream_.Emit(Opcode::Br);
  label->fixup_offset = istream_.EmitFixupU32();
  istream_.ResolveFixupU32(fixup_cond_offset);
  return Result::Ok;
}